

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDAFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  string *psVar2;
  string _err;
  string filepath;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string base_dir;
  MMapFileHandle handle;
  string local_f0;
  Stage *local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  MMapFileHandle local_68;
  
  io::ExpandFilePath(&local_c8,(string *)_filename,(void *)0x0);
  io::GetBaseDir(&local_88,(string *)_filename);
  bVar1 = io::IsMMapSupported();
  if (!bVar1) {
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
                              (string *)err,&local_c8,(long)options->max_memory_limit_in_mb << 0x14,
                              (void *)0x0);
    if ((err != (string *)0x0) && (!bVar1)) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"File not found or failed to read : \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c8);
      ::std::operator+(&local_68.filename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\"\n");
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    bVar1 = LoadUSDAFromMemory((uint8_t *)local_a8._M_dataplus._M_p,
                               local_a8._M_string_length - (long)local_a8._M_dataplus._M_p,
                               (string *)&local_88,stage,warn,err,options);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
    goto LAB_001158e5;
  }
  local_68.filename._M_dataplus._M_p = (pointer)&local_68.filename.field_2;
  local_68.filename._M_string_length = 0;
  local_68.filename.field_2._M_local_buf[0] = '\0';
  local_68.writable = false;
  local_68.addr = (uint8_t *)0x0;
  local_68.size = 0;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_d0 = stage;
  bVar1 = io::MMapFile(&local_c8,&local_68,false,&local_f0);
  if (bVar1) {
    if ((warn != (string *)0x0) && (local_f0._M_string_length != 0)) {
      ::std::operator+(&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\n");
      psVar2 = warn;
LAB_0011582a:
      ::std::__cxx11::string::append((string *)psVar2);
      ::std::__cxx11::string::_M_dispose();
    }
  }
  else if (err != (string *)0x0) {
    ::std::operator+(&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                     "\n");
    psVar2 = err;
    goto LAB_0011582a;
  }
  ::std::__cxx11::string::_M_dispose();
  if (bVar1) {
    bVar1 = LoadUSDAFromMemory(local_68.addr,local_68.size,(string *)&local_c8,local_d0,warn,err,
                               options);
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    io::UnmapFile(&local_68,&local_f0);
    if ((warn != (string *)0x0) && (local_f0._M_string_length != 0)) {
      ::std::operator+(&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\n");
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    bVar1 = false;
  }
  ::std::__cxx11::string::_M_dispose();
LAB_001158e5:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool LoadUSDAFromFile(const std::string &_filename, Stage *stage,
                      std::string *warn, std::string *err,
                      const USDLoadOptions &options) {
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDAFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;
  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      if (err) {
        (*err) += "File not found or failed to read : \"" + filepath + "\"\n";
      }
    }

    return LoadUSDAFromMemory(data.data(), data.size(), base_dir, stage, warn,
                              err, options);
  }
}